

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.h
# Opt level: O3

void __thiscall
psy::C::SemanticModelTester::SemanticModelTester(SemanticModelTester *this,TestSuite *suite)

{
  code **ppcVar1;
  long lVar2;
  initializer_list<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>
  __l;
  allocator_type local_2a69 [9];
  code *local_2a60 [2];
  code *local_2a50;
  code *local_2a48;
  char *local_2a40;
  code *local_2a38;
  undefined8 local_2a30;
  code *local_2a28;
  code *local_2a20;
  char *local_2a18;
  code *local_2a10;
  undefined8 local_2a08;
  code *local_2a00;
  code *local_29f8;
  char *local_29f0;
  code *local_29e8;
  undefined8 local_29e0;
  code *local_29d8;
  code *local_29d0;
  char *local_29c8;
  code *local_29c0;
  undefined8 local_29b8;
  code *local_29b0;
  code *local_29a8;
  char *local_29a0;
  code *local_2998;
  undefined8 local_2990;
  code *local_2988;
  code *local_2980;
  char *local_2978;
  code *local_2970;
  undefined8 local_2968;
  code *local_2960;
  code *local_2958;
  char *local_2950;
  code *local_2948;
  undefined8 local_2940;
  code *local_2938;
  code *local_2930;
  char *local_2928;
  code *local_2920;
  undefined8 local_2918;
  code *local_2910;
  code *local_2908;
  char *local_2900;
  code *local_28f8;
  undefined8 local_28f0;
  code *local_28e8;
  code *local_28e0;
  char *local_28d8;
  code *local_28d0;
  undefined8 local_28c8;
  code *local_28c0;
  code *local_28b8;
  char *local_28b0;
  code *local_28a8;
  undefined8 local_28a0;
  code *local_2898;
  code *local_2890;
  char *local_2888;
  code *local_2880;
  undefined8 local_2878;
  code *local_2870;
  code *local_2868;
  char *local_2860;
  code *local_2858;
  undefined8 local_2850;
  code *local_2848;
  code *local_2840;
  char *local_2838;
  code *local_2830;
  undefined8 local_2828;
  code *local_2820;
  code *local_2818;
  char *local_2810;
  code *local_2808;
  undefined8 local_2800;
  code *local_27f8;
  code *local_27f0;
  char *local_27e8;
  code *local_27e0;
  undefined8 local_27d8;
  code *local_27d0;
  code *local_27c8;
  char *local_27c0;
  code *local_27b8;
  undefined8 local_27b0;
  code *local_27a8;
  code *local_27a0;
  char *local_2798;
  code *local_2790;
  undefined8 local_2788;
  code *local_2780;
  code *local_2778;
  char *local_2770;
  code *local_2768;
  undefined8 local_2760;
  code *local_2758;
  code *local_2750;
  char *local_2748;
  code *local_2740;
  undefined8 local_2738;
  code *local_2730;
  code *local_2728;
  char *local_2720;
  code *local_2718;
  undefined8 local_2710;
  code *local_2708;
  code *local_2700;
  char *local_26f8;
  code *local_26f0;
  undefined8 local_26e8;
  code *local_26e0;
  code *local_26d8;
  char *local_26d0;
  code *local_26c8;
  undefined8 local_26c0;
  code *local_26b8;
  code *local_26b0;
  char *local_26a8;
  code *local_26a0;
  undefined8 local_2698;
  code *local_2690;
  code *local_2688;
  char *local_2680;
  code *local_2678;
  undefined8 local_2670;
  code *local_2668;
  code *local_2660;
  char *local_2658;
  code *local_2650;
  undefined8 local_2648;
  code *local_2640;
  code *local_2638;
  char *local_2630;
  code *local_2628;
  undefined8 local_2620;
  code *local_2618;
  code *local_2610;
  char *local_2608;
  code *local_2600;
  undefined8 local_25f8;
  code *local_25f0;
  code *local_25e8;
  char *local_25e0;
  code *local_25d8;
  undefined8 local_25d0;
  code *local_25c8;
  code *local_25c0;
  char *local_25b8;
  code *local_25b0;
  undefined8 local_25a8;
  code *local_25a0;
  code *local_2598;
  char *local_2590;
  code *local_2588;
  undefined8 local_2580;
  code *local_2578;
  code *local_2570;
  char *local_2568;
  code *local_2560;
  undefined8 local_2558;
  code *local_2550;
  code *local_2548;
  char *local_2540;
  code *local_2538;
  undefined8 local_2530;
  code *local_2528;
  code *local_2520;
  char *local_2518;
  code *local_2510;
  undefined8 local_2508;
  code *local_2500;
  code *local_24f8;
  char *local_24f0;
  code *local_24e8;
  undefined8 local_24e0;
  code *local_24d8;
  code *local_24d0;
  char *local_24c8;
  code *local_24c0;
  undefined8 local_24b8;
  code *local_24b0;
  code *local_24a8;
  char *local_24a0;
  code *local_2498;
  undefined8 local_2490;
  code *local_2488;
  code *local_2480;
  char *local_2478;
  code *local_2470;
  undefined8 local_2468;
  code *local_2460;
  code *local_2458;
  char *local_2450;
  code *local_2448;
  undefined8 local_2440;
  code *local_2438;
  code *local_2430;
  char *local_2428;
  code *local_2420;
  undefined8 local_2418;
  code *local_2410;
  code *local_2408;
  char *local_2400;
  code *local_23f8;
  undefined8 local_23f0;
  code *local_23e8;
  code *local_23e0;
  char *local_23d8;
  code *local_23d0;
  undefined8 local_23c8;
  code *local_23c0;
  code *local_23b8;
  char *local_23b0;
  code *local_23a8;
  undefined8 local_23a0;
  code *local_2398;
  code *local_2390;
  char *local_2388;
  code *local_2380;
  undefined8 local_2378;
  code *local_2370;
  code *local_2368;
  char *local_2360;
  code *local_2358;
  undefined8 local_2350;
  code *local_2348;
  code *local_2340;
  char *local_2338;
  code *local_2330;
  undefined8 local_2328;
  code *local_2320;
  code *local_2318;
  char *local_2310;
  code *local_2308;
  undefined8 local_2300;
  code *local_22f8;
  code *local_22f0;
  char *local_22e8;
  code *local_22e0;
  undefined8 local_22d8;
  code *local_22d0;
  code *local_22c8;
  char *local_22c0;
  code *local_22b8;
  undefined8 local_22b0;
  code *local_22a8;
  code *local_22a0;
  char *local_2298;
  code *local_2290;
  undefined8 local_2288;
  code *local_2280;
  code *local_2278;
  char *local_2270;
  code *local_2268;
  undefined8 local_2260;
  code *local_2258;
  code *local_2250;
  char *local_2248;
  code *local_2240;
  undefined8 local_2238;
  code *local_2230;
  code *local_2228;
  char *local_2220;
  code *local_2218;
  undefined8 local_2210;
  code *local_2208;
  code *local_2200;
  char *local_21f8;
  code *local_21f0;
  undefined8 local_21e8;
  code *local_21e0;
  code *local_21d8;
  char *local_21d0;
  code *local_21c8;
  undefined8 local_21c0;
  code *local_21b8;
  code *local_21b0;
  char *local_21a8;
  code *local_21a0;
  undefined8 local_2198;
  code *local_2190;
  code *local_2188;
  char *local_2180;
  code *local_2178;
  undefined8 local_2170;
  code *local_2168;
  code *local_2160;
  char *local_2158;
  code *local_2150;
  undefined8 local_2148;
  code *local_2140;
  code *local_2138;
  char *local_2130;
  code *local_2128;
  undefined8 local_2120;
  code *local_2118;
  code *local_2110;
  char *local_2108;
  code *local_2100;
  undefined8 local_20f8;
  code *local_20f0;
  code *local_20e8;
  char *local_20e0;
  code *local_20d8;
  undefined8 local_20d0;
  code *local_20c8;
  code *local_20c0;
  char *local_20b8;
  code *local_20b0;
  undefined8 local_20a8;
  code *local_20a0;
  code *local_2098;
  char *local_2090;
  code *local_2088;
  undefined8 local_2080;
  code *local_2078;
  code *local_2070;
  char *local_2068;
  code *local_2060;
  undefined8 local_2058;
  code *local_2050;
  code *local_2048;
  char *local_2040;
  code *local_2038;
  undefined8 local_2030;
  code *local_2028;
  code *local_2020;
  char *local_2018;
  code *local_2010;
  undefined8 local_2008;
  code *local_2000;
  code *local_1ff8;
  char *local_1ff0;
  code *local_1fe8;
  undefined8 local_1fe0;
  code *local_1fd8;
  code *local_1fd0;
  char *local_1fc8;
  code *local_1fc0;
  undefined8 local_1fb8;
  code *local_1fb0;
  code *local_1fa8;
  char *local_1fa0;
  code *local_1f98;
  undefined8 local_1f90;
  code *local_1f88;
  code *local_1f80;
  char *local_1f78;
  code *local_1f70;
  undefined8 local_1f68;
  code *local_1f60;
  code *local_1f58;
  char *local_1f50;
  code *local_1f48;
  undefined8 local_1f40;
  code *local_1f38;
  code *local_1f30;
  char *local_1f28;
  code *local_1f20;
  undefined8 local_1f18;
  code *local_1f10;
  code *local_1f08;
  char *local_1f00;
  code *local_1ef8;
  undefined8 local_1ef0;
  code *local_1ee8;
  code *local_1ee0;
  char *local_1ed8;
  code *local_1ed0;
  undefined8 local_1ec8;
  code *local_1ec0;
  code *local_1eb8;
  char *local_1eb0;
  code *local_1ea8;
  undefined8 local_1ea0;
  code *local_1e98;
  code *local_1e90;
  char *local_1e88;
  code *local_1e80;
  undefined8 local_1e78;
  code *local_1e70;
  code *local_1e68;
  char *local_1e60;
  code *local_1e58;
  undefined8 local_1e50;
  code *local_1e48;
  code *local_1e40;
  char *local_1e38;
  code *local_1e30;
  undefined8 local_1e28;
  code *local_1e20;
  code *local_1e18;
  char *local_1e10;
  code *local_1e08;
  undefined8 local_1e00;
  code *local_1df8;
  code *local_1df0;
  char *local_1de8;
  code *local_1de0;
  undefined8 local_1dd8;
  code *local_1dd0;
  code *local_1dc8;
  char *local_1dc0;
  code *local_1db8;
  undefined8 local_1db0;
  code *local_1da8;
  code *local_1da0;
  char *local_1d98;
  code *local_1d90;
  undefined8 local_1d88;
  code *local_1d80;
  code *local_1d78;
  char *local_1d70;
  code *local_1d68;
  undefined8 local_1d60;
  code *local_1d58;
  code *local_1d50;
  char *local_1d48;
  code *local_1d40;
  undefined8 local_1d38;
  code *local_1d30;
  code *local_1d28;
  char *local_1d20;
  code *local_1d18;
  undefined8 local_1d10;
  code *local_1d08;
  code *local_1d00;
  char *local_1cf8;
  code *local_1cf0;
  undefined8 local_1ce8;
  code *local_1ce0;
  code *local_1cd8;
  char *local_1cd0;
  code *local_1cc8;
  undefined8 local_1cc0;
  code *local_1cb8;
  code *local_1cb0;
  char *local_1ca8;
  code *local_1ca0;
  undefined8 local_1c98;
  code *local_1c90;
  code *local_1c88;
  char *local_1c80;
  code *local_1c78;
  undefined8 local_1c70;
  code *local_1c68;
  code *local_1c60;
  char *local_1c58;
  code *local_1c50;
  undefined8 local_1c48;
  code *local_1c40;
  code *local_1c38;
  char *local_1c30;
  code *local_1c28;
  undefined8 local_1c20;
  code *local_1c18;
  code *local_1c10;
  char *local_1c08;
  code *local_1c00;
  undefined8 local_1bf8;
  code *local_1bf0;
  code *local_1be8;
  char *local_1be0;
  code *local_1bd8;
  undefined8 local_1bd0;
  code *local_1bc8;
  code *local_1bc0;
  char *local_1bb8;
  code *local_1bb0;
  undefined8 local_1ba8;
  code *local_1ba0;
  code *local_1b98;
  char *local_1b90;
  code *local_1b88;
  undefined8 local_1b80;
  code *local_1b78;
  code *local_1b70;
  char *local_1b68;
  code *local_1b60;
  undefined8 local_1b58;
  code *local_1b50;
  code *local_1b48;
  char *local_1b40;
  code *local_1b38;
  undefined8 local_1b30;
  code *local_1b28;
  code *local_1b20;
  char *local_1b18;
  code *local_1b10;
  undefined8 local_1b08;
  code *local_1b00;
  code *local_1af8;
  char *local_1af0;
  code *local_1ae8;
  undefined8 local_1ae0;
  code *local_1ad8;
  code *local_1ad0;
  char *local_1ac8;
  code *local_1ac0;
  undefined8 local_1ab8;
  code *local_1ab0;
  code *local_1aa8;
  char *local_1aa0;
  code *local_1a98;
  undefined8 local_1a90;
  code *local_1a88;
  code *local_1a80;
  char *local_1a78;
  code *local_1a70;
  undefined8 local_1a68;
  code *local_1a60;
  code *local_1a58;
  char *local_1a50;
  code *local_1a48;
  undefined8 local_1a40;
  code *local_1a38;
  code *local_1a30;
  char *local_1a28;
  code *local_1a20;
  undefined8 local_1a18;
  code *local_1a10;
  code *local_1a08;
  char *local_1a00;
  code *local_19f8;
  undefined8 local_19f0;
  code *local_19e8;
  code *local_19e0;
  char *local_19d8;
  code *local_19d0;
  undefined8 local_19c8;
  code *local_19c0;
  code *local_19b8;
  char *local_19b0;
  code *local_19a8;
  undefined8 local_19a0;
  code *local_1998;
  code *local_1990;
  char *local_1988;
  code *local_1980;
  undefined8 local_1978;
  code *local_1970;
  code *local_1968;
  char *local_1960;
  code *local_1958;
  undefined8 local_1950;
  code *local_1948;
  code *local_1940;
  char *local_1938;
  code *local_1930;
  undefined8 local_1928;
  code *local_1920;
  code *local_1918;
  char *local_1910;
  code *local_1908;
  undefined8 local_1900;
  code *local_18f8;
  code *local_18f0;
  char *local_18e8;
  code *local_18e0;
  undefined8 local_18d8;
  code *local_18d0;
  code *local_18c8;
  char *local_18c0;
  code *local_18b8;
  undefined8 local_18b0;
  code *local_18a8;
  code *local_18a0;
  char *local_1898;
  code *local_1890;
  undefined8 local_1888;
  code *local_1880;
  code *local_1878;
  char *local_1870;
  code *local_1868;
  undefined8 local_1860;
  code *local_1858;
  code *local_1850;
  char *local_1848;
  code *local_1840;
  undefined8 local_1838;
  code *local_1830;
  code *local_1828;
  char *local_1820;
  code *local_1818;
  undefined8 local_1810;
  code *local_1808;
  code *local_1800;
  char *local_17f8;
  code *local_17f0;
  undefined8 local_17e8;
  code *local_17e0;
  code *local_17d8;
  char *local_17d0;
  code *local_17c8;
  undefined8 local_17c0;
  code *local_17b8;
  code *local_17b0;
  char *local_17a8;
  code *local_17a0;
  undefined8 local_1798;
  code *local_1790;
  code *local_1788;
  char *local_1780;
  code *local_1778;
  undefined8 local_1770;
  code *local_1768;
  code *local_1760;
  char *local_1758;
  code *local_1750;
  undefined8 local_1748;
  code *local_1740;
  code *local_1738;
  char *local_1730;
  code *local_1728;
  undefined8 local_1720;
  code *local_1718;
  code *local_1710;
  char *local_1708;
  code *local_1700;
  undefined8 local_16f8;
  code *local_16f0;
  code *local_16e8;
  char *local_16e0;
  code *local_16d8;
  undefined8 local_16d0;
  code *local_16c8;
  code *local_16c0;
  char *local_16b8;
  code *local_16b0;
  undefined8 local_16a8;
  code *local_16a0;
  code *local_1698;
  char *local_1690;
  code *local_1688;
  undefined8 local_1680;
  code *local_1678;
  code *local_1670;
  char *local_1668;
  code *local_1660;
  undefined8 local_1658;
  code *local_1650;
  code *local_1648;
  char *local_1640;
  code *local_1638;
  undefined8 local_1630;
  code *local_1628;
  code *local_1620;
  char *local_1618;
  code *local_1610;
  undefined8 local_1608;
  code *local_1600;
  code *local_15f8;
  char *local_15f0;
  code *local_15e8;
  undefined8 local_15e0;
  code *local_15d8;
  code *local_15d0;
  char *local_15c8;
  code *local_15c0;
  undefined8 local_15b8;
  code *local_15b0;
  code *local_15a8;
  char *local_15a0;
  code *local_1598;
  undefined8 local_1590;
  code *local_1588;
  code *local_1580;
  char *local_1578;
  code *local_1570;
  undefined8 local_1568;
  code *local_1560;
  code *local_1558;
  char *local_1550;
  code *local_1548;
  undefined8 local_1540;
  code *local_1538;
  code *local_1530;
  char *local_1528;
  code *local_1520;
  undefined8 local_1518;
  code *local_1510;
  code *local_1508;
  char *local_1500;
  code *local_14f8;
  undefined8 local_14f0;
  code *local_14e8;
  code *local_14e0;
  char *local_14d8;
  code *local_14d0;
  undefined8 local_14c8;
  code *local_14c0;
  code *local_14b8;
  char *local_14b0;
  code *local_14a8;
  undefined8 local_14a0;
  code *local_1498;
  code *local_1490;
  char *local_1488;
  code *local_1480;
  undefined8 local_1478;
  code *local_1470;
  code *local_1468;
  char *local_1460;
  code *local_1458;
  undefined8 local_1450;
  code *local_1448;
  code *local_1440;
  char *local_1438;
  code *local_1430;
  undefined8 local_1428;
  code *local_1420;
  code *local_1418;
  char *local_1410;
  code *local_1408;
  undefined8 local_1400;
  code *local_13f8;
  code *local_13f0;
  char *local_13e8;
  code *local_13e0;
  undefined8 local_13d8;
  code *local_13d0;
  code *local_13c8;
  char *local_13c0;
  code *local_13b8;
  undefined8 local_13b0;
  code *local_13a8;
  code *local_13a0;
  char *local_1398;
  code *local_1390;
  undefined8 local_1388;
  code *local_1380;
  code *local_1378;
  char *local_1370;
  code *local_1368;
  undefined8 local_1360;
  code *local_1358;
  code *local_1350;
  char *local_1348;
  code *local_1340;
  undefined8 local_1338;
  code *local_1330;
  code *local_1328;
  char *local_1320;
  code *local_1318;
  undefined8 local_1310;
  code *local_1308;
  code *local_1300;
  char *local_12f8;
  code *local_12f0;
  undefined8 local_12e8;
  code *local_12e0;
  code *local_12d8;
  char *local_12d0;
  code *local_12c8;
  undefined8 local_12c0;
  code *local_12b8;
  code *local_12b0;
  char *local_12a8;
  code *local_12a0;
  undefined8 local_1298;
  code *local_1290;
  code *local_1288;
  char *local_1280;
  code *local_1278;
  undefined8 local_1270;
  code *local_1268;
  code *local_1260;
  char *local_1258;
  code *local_1250;
  undefined8 local_1248;
  code *local_1240;
  code *local_1238;
  char *local_1230;
  code *local_1228;
  undefined8 local_1220;
  code *local_1218;
  code *local_1210;
  char *local_1208;
  code *local_1200;
  undefined8 local_11f8;
  code *local_11f0;
  code *local_11e8;
  char *local_11e0;
  code *local_11d8;
  undefined8 local_11d0;
  code *local_11c8;
  code *local_11c0;
  char *local_11b8;
  code *local_11b0;
  undefined8 local_11a8;
  code *local_11a0;
  code *local_1198;
  char *local_1190;
  code *local_1188;
  undefined8 local_1180;
  code *local_1178;
  code *local_1170;
  char *local_1168;
  code *local_1160;
  undefined8 local_1158;
  code *local_1150;
  code *local_1148;
  char *local_1140;
  code *local_1138;
  undefined8 local_1130;
  code *local_1128;
  code *local_1120;
  char *local_1118;
  code *local_1110;
  undefined8 local_1108;
  code *local_1100;
  code *local_10f8;
  char *local_10f0;
  code *local_10e8;
  undefined8 local_10e0;
  code *local_10d8;
  code *local_10d0;
  char *local_10c8;
  code *local_10c0;
  undefined8 local_10b8;
  code *local_10b0;
  code *local_10a8;
  char *local_10a0;
  code *local_1098;
  undefined8 local_1090;
  code *local_1088;
  code *local_1080;
  char *local_1078;
  code *local_1070;
  undefined8 local_1068;
  code *local_1060;
  code *local_1058;
  char *local_1050;
  code *local_1048;
  undefined8 local_1040;
  code *local_1038;
  code *local_1030;
  char *local_1028;
  code *local_1020;
  undefined8 local_1018;
  code *local_1010;
  code *local_1008;
  char *local_1000;
  code *local_ff8;
  undefined8 local_ff0;
  code *local_fe8;
  code *local_fe0;
  char *local_fd8;
  code *local_fd0;
  undefined8 local_fc8;
  code *local_fc0;
  code *local_fb8;
  char *local_fb0;
  code *local_fa8;
  undefined8 local_fa0;
  code *local_f98;
  code *local_f90;
  char *local_f88;
  code *local_f80;
  undefined8 local_f78;
  code *local_f70;
  code *local_f68;
  char *local_f60;
  code *local_f58;
  undefined8 local_f50;
  code *local_f48;
  code *local_f40;
  char *local_f38;
  code *local_f30;
  undefined8 local_f28;
  code *local_f20;
  code *local_f18;
  char *local_f10;
  code *local_f08;
  undefined8 local_f00;
  code *local_ef8;
  code *local_ef0;
  char *local_ee8;
  code *local_ee0;
  undefined8 local_ed8;
  code *local_ed0;
  code *local_ec8;
  char *local_ec0;
  code *local_eb8;
  undefined8 local_eb0;
  code *local_ea8;
  code *local_ea0;
  char *local_e98;
  code *local_e90;
  undefined8 local_e88;
  code *local_e80;
  code *local_e78;
  char *local_e70;
  code *local_e68;
  undefined8 local_e60;
  code *local_e58;
  code *local_e50;
  char *local_e48;
  code *local_e40;
  undefined8 local_e38;
  code *local_e30;
  code *local_e28;
  char *local_e20;
  code *local_e18;
  undefined8 local_e10;
  code *local_e08;
  code *local_e00;
  char *local_df8;
  code *local_df0;
  undefined8 local_de8;
  code *local_de0;
  code *local_dd8;
  char *local_dd0;
  code *local_dc8;
  undefined8 local_dc0;
  code *local_db8;
  code *local_db0;
  char *local_da8;
  code *local_da0;
  undefined8 local_d98;
  code *local_d90;
  code *local_d88;
  char *local_d80;
  code *local_d78;
  undefined8 local_d70;
  code *local_d68;
  code *local_d60;
  char *local_d58;
  code *local_d50;
  undefined8 local_d48;
  code *local_d40;
  code *local_d38;
  char *local_d30;
  code *local_d28;
  undefined8 local_d20;
  code *local_d18;
  code *local_d10;
  char *local_d08;
  code *local_d00;
  undefined8 local_cf8;
  code *local_cf0;
  code *local_ce8;
  char *local_ce0;
  code *local_cd8;
  undefined8 local_cd0;
  code *local_cc8;
  code *local_cc0;
  char *local_cb8;
  code *local_cb0;
  undefined8 local_ca8;
  code *local_ca0;
  code *local_c98;
  char *local_c90;
  code *local_c88;
  undefined8 local_c80;
  code *local_c78;
  code *local_c70;
  char *local_c68;
  code *local_c60;
  undefined8 local_c58;
  code *local_c50;
  code *local_c48;
  char *local_c40;
  code *local_c38;
  undefined8 local_c30;
  code *local_c28;
  code *local_c20;
  char *local_c18;
  code *local_c10;
  undefined8 local_c08;
  code *local_c00;
  code *local_bf8;
  char *local_bf0;
  code *local_be8;
  undefined8 local_be0;
  code *local_bd8;
  code *local_bd0;
  char *local_bc8;
  code *local_bc0;
  undefined8 local_bb8;
  code *local_bb0;
  code *local_ba8;
  char *local_ba0;
  code *local_b98;
  undefined8 local_b90;
  code *local_b88;
  code *local_b80;
  char *local_b78;
  code *local_b70;
  undefined8 local_b68;
  code *local_b60;
  code *local_b58;
  char *local_b50;
  code *local_b48;
  undefined8 local_b40;
  code *local_b38;
  code *local_b30;
  char *local_b28;
  code *local_b20;
  undefined8 local_b18;
  code *local_b10;
  code *local_b08;
  char *local_b00;
  code *local_af8;
  undefined8 local_af0;
  code *local_ae8;
  code *local_ae0;
  char *local_ad8;
  code *local_ad0;
  undefined8 local_ac8;
  code *local_ac0;
  code *local_ab8;
  char *local_ab0;
  code *local_aa8;
  undefined8 local_aa0;
  code *local_a98;
  code *local_a90;
  char *local_a88;
  code *local_a80;
  undefined8 local_a78;
  code *local_a70;
  code *local_a68;
  char *local_a60;
  code *local_a58;
  undefined8 local_a50;
  code *local_a48;
  code *local_a40;
  char *local_a38;
  code *local_a30;
  undefined8 local_a28;
  code *local_a20;
  code *local_a18;
  char *local_a10;
  code *local_a08;
  undefined8 local_a00;
  code *local_9f8;
  code *local_9f0;
  char *local_9e8;
  code *local_9e0;
  undefined8 local_9d8;
  code *local_9d0;
  code *local_9c8;
  char *local_9c0;
  code *local_9b8;
  undefined8 local_9b0;
  code *local_9a8;
  code *local_9a0;
  char *local_998;
  code *local_990;
  undefined8 local_988;
  code *local_980;
  code *local_978;
  char *local_970;
  code *local_968;
  undefined8 local_960;
  code *local_958;
  code *local_950;
  char *local_948;
  code *local_940;
  undefined8 local_938;
  code *local_930;
  code *local_928;
  char *local_920;
  code *local_918;
  undefined8 local_910;
  code *local_908;
  code *local_900;
  char *local_8f8;
  code *local_8f0;
  undefined8 local_8e8;
  code *local_8e0;
  code *local_8d8;
  char *local_8d0;
  code *local_8c8;
  undefined8 local_8c0;
  code *local_8b8;
  code *local_8b0;
  char *local_8a8;
  code *local_8a0;
  undefined8 local_898;
  code *local_890;
  code *local_888;
  char *local_880;
  code *local_878;
  undefined8 local_870;
  code *local_868;
  code *local_860;
  char *local_858;
  code *local_850;
  undefined8 local_848;
  code *local_840;
  code *local_838;
  char *local_830;
  code *local_828;
  undefined8 local_820;
  code *local_818;
  code *local_810;
  char *local_808;
  code *local_800;
  undefined8 local_7f8;
  code *local_7f0;
  code *local_7e8;
  char *local_7e0;
  code *local_7d8;
  undefined8 local_7d0;
  code *local_7c8;
  code *local_7c0;
  char *local_7b8;
  code *local_7b0;
  undefined8 local_7a8;
  code *local_7a0;
  code *local_798;
  char *local_790;
  code *local_788;
  undefined8 local_780;
  code *local_778;
  code *local_770;
  char *local_768;
  code *local_760;
  undefined8 local_758;
  code *local_750;
  code *local_748;
  char *local_740;
  code *local_738;
  undefined8 local_730;
  code *local_728;
  code *local_720;
  char *local_718;
  code *local_710;
  undefined8 local_708;
  code *local_700;
  code *local_6f8;
  char *local_6f0;
  code *local_6e8;
  undefined8 local_6e0;
  code *local_6d8;
  code *local_6d0;
  char *local_6c8;
  code *local_6c0;
  undefined8 local_6b8;
  code *local_6b0;
  code *local_6a8;
  char *local_6a0;
  code *local_698;
  undefined8 local_690;
  code *local_688;
  code *local_680;
  char *local_678;
  code *local_670;
  undefined8 local_668;
  code *local_660;
  code *local_658;
  char *local_650;
  code *local_648;
  undefined8 local_640;
  code *local_638;
  code *local_630;
  char *local_628;
  code *local_620;
  undefined8 local_618;
  code *local_610;
  code *local_608;
  char *local_600;
  code *local_5f8;
  undefined8 local_5f0;
  code *local_5e8;
  code *local_5e0;
  char *local_5d8;
  code *local_5d0;
  undefined8 local_5c8;
  code *local_5c0;
  code *local_5b8;
  char *local_5b0;
  code *local_5a8;
  undefined8 local_5a0;
  code *local_598;
  code *local_590;
  char *local_588;
  code *local_580;
  undefined8 local_578;
  code *local_570;
  code *local_568;
  char *local_560;
  code *local_558;
  undefined8 local_550;
  code *local_548;
  code *local_540;
  char *local_538;
  code *local_530;
  undefined8 local_528;
  code *local_520;
  code *local_518;
  char *local_510;
  code *local_508;
  undefined8 local_500;
  code *local_4f8;
  code *local_4f0;
  char *local_4e8;
  code *local_4e0;
  undefined8 local_4d8;
  code *local_4d0;
  code *local_4c8;
  char *local_4c0;
  code *local_4b8;
  undefined8 local_4b0;
  code *local_4a8;
  code *local_4a0;
  char *local_498;
  code *local_490;
  undefined8 local_488;
  code *local_480;
  code *local_478;
  char *local_470;
  code *local_468;
  undefined8 local_460;
  code *local_458;
  code *local_450;
  char *local_448;
  code *local_440;
  undefined8 local_438;
  code *local_430;
  code *local_428;
  char *local_420;
  code *local_418;
  undefined8 local_410;
  code *local_408;
  code *local_400;
  char *local_3f8;
  code *local_3f0;
  undefined8 local_3e8;
  code *local_3e0;
  code *local_3d8;
  char *local_3d0;
  code *local_3c8;
  undefined8 local_3c0;
  code *local_3b8;
  code *local_3b0;
  char *local_3a8;
  code *local_3a0;
  undefined8 local_398;
  code *local_390;
  code *local_388;
  char *local_380;
  code *local_378;
  undefined8 local_370;
  code *local_368;
  code *local_360;
  char *local_358;
  code *local_350;
  undefined8 local_348;
  code *local_340;
  code *local_338;
  char *local_330;
  code *local_328;
  undefined8 local_320;
  code *local_318;
  code *local_310;
  char *local_308;
  code *local_300;
  undefined8 local_2f8;
  code *local_2f0;
  code *local_2e8;
  char *local_2e0;
  code *local_2d8;
  undefined8 local_2d0;
  code *local_2c8;
  code *local_2c0;
  char *local_2b8;
  code *local_2b0;
  undefined8 local_2a8;
  code *local_2a0;
  code *local_298;
  char *local_290;
  code *local_288;
  undefined8 local_280;
  code *local_278;
  code *local_270;
  char *local_268;
  code *local_260;
  undefined8 local_258;
  code *local_250;
  code *local_248;
  char *local_240;
  code *local_238;
  undefined8 local_230;
  code *local_228;
  code *local_220;
  char *local_218;
  code *local_210;
  undefined8 local_208;
  code *local_200;
  code *local_1f8;
  char *local_1f0;
  code *local_1e8;
  undefined8 local_1e0;
  code *local_1d8;
  code *local_1d0;
  char *local_1c8;
  code *local_1c0;
  undefined8 local_1b8;
  code *local_1b0;
  code *local_1a8;
  char *local_1a0;
  code *local_198;
  undefined8 local_190;
  code *local_188;
  code *local_180;
  char *local_178;
  code *local_170;
  undefined8 local_168;
  code *local_160;
  code *local_158;
  char *local_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  code *local_130;
  char *local_128;
  code *local_120;
  undefined8 local_118;
  code *local_110;
  code *local_108;
  char *local_100;
  code *local_f8;
  undefined8 local_f0;
  code *local_e8;
  code *local_e0;
  char *local_d8;
  code *local_d0;
  undefined8 local_c8;
  code *local_c0;
  code *local_b8;
  char *local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  code *local_90;
  char *local_88;
  code *local_80;
  undefined8 local_78;
  code *local_70;
  code *local_68;
  char *local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  code *local_40;
  char *local_38;
  
  (this->super_Tester).suite_ = suite;
  (this->super_Tester).cntPassed_ = 0;
  (this->super_Tester).cntFailed_ = 0;
  (this->super_Tester).curTestFunc_._M_dataplus._M_p =
       (pointer)&(this->super_Tester).curTestFunc_.field_2;
  (this->super_Tester).curTestFunc_._M_string_length = 0;
  (this->super_Tester).curTestFunc_.field_2._M_local_buf[0] = '\0';
  (this->super_Tester)._vptr_Tester = (_func_int **)&PTR__SemanticModelTester_00522390;
  (this->tree_)._M_t.
  super___uniq_ptr_impl<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::SyntaxTree_*,_std::default_delete<psy::C::SyntaxTree>_>.
  super__Head_base<0UL,_psy::C::SyntaxTree_*,_false>._M_head_impl = (SyntaxTree *)0x0;
  (this->compilation_)._M_t.
  super___uniq_ptr_impl<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>._M_t.
  super__Tuple_impl<0UL,_psy::C::Compilation_*,_std::default_delete<psy::C::Compilation>_>.
  super__Head_base<0UL,_psy::C::Compilation_*,_false>._M_head_impl = (Compilation *)0x0;
  local_2a60[0] = case0001;
  local_2a60[1] = (code *)0x0;
  local_2a48 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2a50 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2a40 = "case0001";
  local_2a38 = case0002;
  local_2a30 = 0;
  local_2a20 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2a28 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2a18 = "case0002";
  local_2a10 = case0003;
  local_2a08 = 0;
  local_29f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2a00 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_29f0 = "case0003";
  local_29e8 = case0004;
  local_29e0 = 0;
  local_29d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_29d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_29c8 = "case0004";
  local_29c0 = case0005;
  local_29b8 = 0;
  local_29a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_29b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_29a0 = "case0005";
  local_2998 = case0006;
  local_2990 = 0;
  local_2980 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2988 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2978 = "case0006";
  local_2970 = case0007;
  local_2968 = 0;
  local_2958 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2960 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2950 = "case0007";
  local_2948 = case0008;
  local_2940 = 0;
  local_2930 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2938 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2928 = "case0008";
  local_2920 = case0009;
  local_2918 = 0;
  local_2908 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2910 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2900 = "case0009";
  local_28f8 = case0010;
  local_28f0 = 0;
  local_28e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_28e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_28d8 = "case0010";
  local_28d0 = case0090;
  local_28c8 = 0;
  local_28b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_28c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_28b0 = "case0090";
  local_28a8 = case0091;
  local_28a0 = 0;
  local_2890 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2898 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2888 = "case0091";
  local_2880 = case0092;
  local_2878 = 0;
  local_2868 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2870 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2860 = "case0092";
  local_2858 = case0093;
  local_2850 = 0;
  local_2840 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2848 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2838 = "case0093";
  local_2830 = case0094;
  local_2828 = 0;
  local_2818 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2820 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2810 = "case0094";
  local_2808 = case0095;
  local_2800 = 0;
  local_27f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_27f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_27e8 = "case0095";
  local_27e0 = case0096;
  local_27d8 = 0;
  local_27c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_27d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_27c0 = "case0096";
  local_27b8 = case0097;
  local_27b0 = 0;
  local_27a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_27a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2798 = "case0097";
  local_2790 = case0098;
  local_2788 = 0;
  local_2778 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2780 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2770 = "case0098";
  local_2768 = case0099;
  local_2760 = 0;
  local_2750 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2758 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2748 = "case0099";
  local_2740 = case0101;
  local_2738 = 0;
  local_2728 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2730 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2720 = "case0101";
  local_2718 = case0102;
  local_2710 = 0;
  local_2700 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2708 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_26f8 = "case0102";
  local_26f0 = case0103;
  local_26e8 = 0;
  local_26d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_26e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_26d0 = "case0103";
  local_26c8 = case0104;
  local_26c0 = 0;
  local_26b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_26b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_26a8 = "case0104";
  local_26a0 = case0105;
  local_2698 = 0;
  local_2688 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2690 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2680 = "case0105";
  local_2678 = case0106;
  local_2670 = 0;
  local_2660 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2668 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2658 = "case0106";
  local_2650 = case0107;
  local_2648 = 0;
  local_2638 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2640 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2630 = "case0107";
  local_2628 = case0108;
  local_2620 = 0;
  local_2610 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2618 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2608 = "case0108";
  local_2600 = case0109;
  local_25f8 = 0;
  local_25e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_25f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_25e0 = "case0109";
  local_25d8 = case0110;
  local_25d0 = 0;
  local_25c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_25c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_25b8 = "case0110";
  local_25b0 = case0150;
  local_25a8 = 0;
  local_2598 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_25a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2590 = "case0150";
  local_2588 = case0151;
  local_2580 = 0;
  local_2570 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2578 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2568 = "case0151";
  local_2560 = case0152;
  local_2558 = 0;
  local_2548 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2550 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2540 = "case0152";
  local_2538 = case0153;
  local_2530 = 0;
  local_2520 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2528 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2518 = "case0153";
  local_2510 = case0154;
  local_2508 = 0;
  local_24f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2500 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_24f0 = "case0154";
  local_24e8 = case0155;
  local_24e0 = 0;
  local_24d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_24d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_24c8 = "case0155";
  local_24c0 = case0156;
  local_24b8 = 0;
  local_24a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_24b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_24a0 = "case0156";
  local_2498 = case0157;
  local_2490 = 0;
  local_2480 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2488 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2478 = "case0157";
  local_2470 = case0158;
  local_2468 = 0;
  local_2458 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2460 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2450 = "case0158";
  local_2448 = case0159;
  local_2440 = 0;
  local_2430 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2438 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2428 = "case0159";
  local_2420 = case0201;
  local_2418 = 0;
  local_2408 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2410 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2400 = "case0201";
  local_23f8 = case0202;
  local_23f0 = 0;
  local_23e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_23e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_23d8 = "case0202";
  local_23d0 = case0203;
  local_23c8 = 0;
  local_23b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_23c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_23b0 = "case0203";
  local_23a8 = case0204;
  local_23a0 = 0;
  local_2390 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2398 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2388 = "case0204";
  local_2380 = case0205;
  local_2378 = 0;
  local_2368 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2370 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2360 = "case0205";
  local_2358 = case0206;
  local_2350 = 0;
  local_2340 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2348 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2338 = "case0206";
  local_2330 = case0207;
  local_2328 = 0;
  local_2318 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2320 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2310 = "case0207";
  local_2308 = case0208;
  local_2300 = 0;
  local_22f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_22f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_22e8 = "case0208";
  local_22e0 = case0209;
  local_22d8 = 0;
  local_22c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_22d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_22c0 = "case0209";
  local_22b8 = case0210;
  local_22b0 = 0;
  local_22a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_22a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2298 = "case0210";
  local_2290 = case0211;
  local_2288 = 0;
  local_2278 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2280 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2270 = "case0211";
  local_2268 = case0212;
  local_2260 = 0;
  local_2250 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2258 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2248 = "case0212";
  local_2240 = case0213;
  local_2238 = 0;
  local_2228 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2230 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2220 = "case0213";
  local_2218 = case0214;
  local_2210 = 0;
  local_2200 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2208 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_21f8 = "case0214";
  local_21f0 = case0215;
  local_21e8 = 0;
  local_21d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_21e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_21d0 = "case0215";
  local_21c8 = case0216;
  local_21c0 = 0;
  local_21b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_21b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_21a8 = "case0216";
  local_21a0 = case0217;
  local_2198 = 0;
  local_2188 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2190 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2180 = "case0217";
  local_2178 = case0218;
  local_2170 = 0;
  local_2160 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2168 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2158 = "case0218";
  local_2150 = case0219;
  local_2148 = 0;
  local_2138 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2140 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2130 = "case0219";
  local_2128 = case0220;
  local_2120 = 0;
  local_2110 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2118 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2108 = "case0220";
  local_2100 = case0300;
  local_20f8 = 0;
  local_20e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_20f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_20e0 = "case0300";
  local_20d8 = case0301;
  local_20d0 = 0;
  local_20c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_20c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_20b8 = "case0301";
  local_20b0 = case0302;
  local_20a8 = 0;
  local_2098 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_20a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2090 = "case0302";
  local_2088 = case0303;
  local_2080 = 0;
  local_2070 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2078 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2068 = "case0303";
  local_2060 = case0304;
  local_2058 = 0;
  local_2048 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2050 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2040 = "case0304";
  local_2038 = case0305;
  local_2030 = 0;
  local_2020 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2028 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_2018 = "case0305";
  local_2010 = case0306;
  local_2008 = 0;
  local_1ff8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_2000 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ff0 = "case0306";
  local_1fe8 = case0307;
  local_1fe0 = 0;
  local_1fd0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1fd8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1fc8 = "case0307";
  local_1fc0 = case0308;
  local_1fb8 = 0;
  local_1fa8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1fb0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1fa0 = "case0308";
  local_1f98 = case0309;
  local_1f90 = 0;
  local_1f80 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1f88 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f78 = "case0309";
  local_1f70 = case0310;
  local_1f68 = 0;
  local_1f58 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1f60 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f50 = "case0310";
  local_1f48 = case0311;
  local_1f40 = 0;
  local_1f30 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1f38 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f28 = "case0311";
  local_1f20 = case0312;
  local_1f18 = 0;
  local_1f08 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1f10 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1f00 = "case0312";
  local_1ef8 = case0313;
  local_1ef0 = 0;
  local_1ee0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ee8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ed8 = "case0313";
  local_1ed0 = case0314;
  local_1ec8 = 0;
  local_1eb8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ec0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1eb0 = "case0314";
  local_1ea8 = case0315;
  local_1ea0 = 0;
  local_1e90 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1e98 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e88 = "case0315";
  local_1e80 = case0316;
  local_1e78 = 0;
  local_1e68 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1e70 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e60 = "case0316";
  local_1e58 = case0317;
  local_1e50 = 0;
  local_1e40 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1e48 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e38 = "case0317";
  local_1e30 = case0318;
  local_1e28 = 0;
  local_1e18 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1e20 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1e10 = "case0318";
  local_1e08 = case0319;
  local_1e00 = 0;
  local_1df0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1df8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1de8 = "case0319";
  local_1de0 = case0320;
  local_1dd8 = 0;
  local_1dc8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1dd0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1dc0 = "case0320";
  local_1db8 = case0321;
  local_1db0 = 0;
  local_1da0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1da8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d98 = "case0321";
  local_1d90 = case0322;
  local_1d88 = 0;
  local_1d78 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1d80 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d70 = "case0322";
  local_1d68 = case0323;
  local_1d60 = 0;
  local_1d50 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1d58 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d48 = "case0323";
  local_1d40 = case0324;
  local_1d38 = 0;
  local_1d28 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1d30 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1d20 = "case0324";
  local_1d18 = case0325;
  local_1d10 = 0;
  local_1d00 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1d08 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1cf8 = "case0325";
  local_1cf0 = case0326;
  local_1ce8 = 0;
  local_1cd8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ce0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1cd0 = "case0326";
  local_1cc8 = case0327;
  local_1cc0 = 0;
  local_1cb0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1cb8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ca8 = "case0327";
  local_1ca0 = case0328;
  local_1c98 = 0;
  local_1c88 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1c90 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c80 = "case0328";
  local_1c78 = case0329;
  local_1c70 = 0;
  local_1c60 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1c68 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c58 = "case0329";
  local_1c50 = case0330;
  local_1c48 = 0;
  local_1c38 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1c40 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c30 = "case0330";
  local_1c28 = case0331;
  local_1c20 = 0;
  local_1c10 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1c18 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1c08 = "case0331";
  local_1c00 = case0332;
  local_1bf8 = 0;
  local_1be8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1bf0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1be0 = "case0332";
  local_1bd8 = case0333;
  local_1bd0 = 0;
  local_1bc0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1bc8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1bb8 = "case0333";
  local_1bb0 = case0334;
  local_1ba8 = 0;
  local_1b98 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ba0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b90 = "case0334";
  local_1b88 = case0335;
  local_1b80 = 0;
  local_1b70 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1b78 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b68 = "case0335";
  local_1b60 = case0336;
  local_1b58 = 0;
  local_1b48 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1b50 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b40 = "case0336";
  local_1b38 = case0337;
  local_1b30 = 0;
  local_1b20 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1b28 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1b18 = "case0337";
  local_1b10 = case0338;
  local_1b08 = 0;
  local_1af8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1b00 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1af0 = "case0338";
  local_1ae8 = case0339;
  local_1ae0 = 0;
  local_1ad0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ad8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1ac8 = "case0339";
  local_1ac0 = case0340;
  local_1ab8 = 0;
  local_1aa8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1ab0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1aa0 = "case0340";
  local_1a98 = case0341;
  local_1a90 = 0;
  local_1a80 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1a88 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a78 = "case0341";
  local_1a70 = case0342;
  local_1a68 = 0;
  local_1a58 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1a60 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a50 = "case0342";
  local_1a48 = case0343;
  local_1a40 = 0;
  local_1a30 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1a38 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a28 = "case0343";
  local_1a20 = case0344;
  local_1a18 = 0;
  local_1a08 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1a10 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1a00 = "case0344";
  local_19f8 = case0345;
  local_19f0 = 0;
  local_19e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_19e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_19d8 = "case0345";
  local_19d0 = case0346;
  local_19c8 = 0;
  local_19b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_19c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_19b0 = "case0346";
  local_19a8 = case0347;
  local_19a0 = 0;
  local_1990 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1998 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1988 = "case0347";
  local_1980 = case0348;
  local_1978 = 0;
  local_1968 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1970 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1960 = "case0348";
  local_1958 = case0349;
  local_1950 = 0;
  local_1940 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1948 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1938 = "case0349";
  local_1930 = case0350;
  local_1928 = 0;
  local_1918 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1920 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1910 = "case0350";
  local_1908 = case0351;
  local_1900 = 0;
  local_18f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_18f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_18e8 = "case0351";
  local_18e0 = case0352;
  local_18d8 = 0;
  local_18c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_18d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_18c0 = "case0352";
  local_18b8 = case0353;
  local_18b0 = 0;
  local_18a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_18a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1898 = "case0353";
  local_1890 = case0354;
  local_1888 = 0;
  local_1878 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1880 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1870 = "case0354";
  local_1868 = case0355;
  local_1860 = 0;
  local_1850 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1858 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1848 = "case0355";
  local_1840 = case0356;
  local_1838 = 0;
  local_1828 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1830 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1820 = "case0356";
  local_1818 = case0357;
  local_1810 = 0;
  local_1800 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1808 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_17f8 = "case0357";
  local_17f0 = case0358;
  local_17e8 = 0;
  local_17d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_17e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_17d0 = "case0358";
  local_17c8 = case0359;
  local_17c0 = 0;
  local_17b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_17b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_17a8 = "case0359";
  local_17a0 = case0360;
  local_1798 = 0;
  local_1788 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1790 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1780 = "case0360";
  local_1778 = case0361;
  local_1770 = 0;
  local_1760 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1768 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1758 = "case0361";
  local_1750 = case0362;
  local_1748 = 0;
  local_1738 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1740 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1730 = "case0362";
  local_1728 = case0363;
  local_1720 = 0;
  local_1710 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1718 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1708 = "case0363";
  local_1700 = case0364;
  local_16f8 = 0;
  local_16e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_16f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_16e0 = "case0364";
  local_16d8 = case0365;
  local_16d0 = 0;
  local_16c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_16c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_16b8 = "case0365";
  local_16b0 = case0366;
  local_16a8 = 0;
  local_1698 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_16a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1690 = "case0366";
  local_1688 = case0367;
  local_1680 = 0;
  local_1670 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1678 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1668 = "case0367";
  local_1660 = case0368;
  local_1658 = 0;
  local_1648 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1650 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1640 = "case0368";
  local_1638 = case0369;
  local_1630 = 0;
  local_1620 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1628 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1618 = "case0369";
  local_1610 = case0370;
  local_1608 = 0;
  local_15f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1600 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_15f0 = "case0370";
  local_15e8 = case0371;
  local_15e0 = 0;
  local_15d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_15d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_15c8 = "case0371";
  local_15c0 = case0372;
  local_15b8 = 0;
  local_15a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_15b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_15a0 = "case0372";
  local_1598 = case0373;
  local_1590 = 0;
  local_1580 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1588 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1578 = "case0373";
  local_1570 = case0374;
  local_1568 = 0;
  local_1558 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1560 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1550 = "case0374";
  local_1548 = case0375;
  local_1540 = 0;
  local_1530 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1538 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1528 = "case0375";
  local_1520 = case0376;
  local_1518 = 0;
  local_1508 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1510 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1500 = "case0376";
  local_14f8 = case0377;
  local_14f0 = 0;
  local_14e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_14e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_14d8 = "case0377";
  local_14d0 = case0378;
  local_14c8 = 0;
  local_14b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_14c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_14b0 = "case0378";
  local_14a8 = case0379;
  local_14a0 = 0;
  local_1490 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1498 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1488 = "case0379";
  local_1480 = case0380;
  local_1478 = 0;
  local_1468 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1470 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1460 = "case0380";
  local_1458 = case0381;
  local_1450 = 0;
  local_1440 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1448 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1438 = "case0381";
  local_1430 = case0382;
  local_1428 = 0;
  local_1418 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1420 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1410 = "case0382";
  local_1408 = case0383;
  local_1400 = 0;
  local_13f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_13f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_13e8 = "case0383";
  local_13e0 = case0384;
  local_13d8 = 0;
  local_13c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_13d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_13c0 = "case0384";
  local_13b8 = case0385;
  local_13b0 = 0;
  local_13a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_13a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1398 = "case0385";
  local_1390 = case0386;
  local_1388 = 0;
  local_1378 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1380 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1370 = "case0386";
  local_1368 = case0387;
  local_1360 = 0;
  local_1350 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1358 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1348 = "case0387";
  local_1340 = case0388;
  local_1338 = 0;
  local_1328 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1330 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1320 = "case0388";
  local_1318 = case0389;
  local_1310 = 0;
  local_1300 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1308 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_12f8 = "case0389";
  local_12f0 = case0390;
  local_12e8 = 0;
  local_12d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_12e0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_12d0 = "case0390";
  local_12c8 = case0391;
  local_12c0 = 0;
  local_12b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_12b8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_12a8 = "case0391";
  local_12a0 = case0392;
  local_1298 = 0;
  local_1288 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1290 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1280 = "case0392";
  local_1278 = case0393;
  local_1270 = 0;
  local_1260 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1268 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1258 = "case0393";
  local_1250 = case0394;
  local_1248 = 0;
  local_1238 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1240 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1230 = "case0394";
  local_1228 = case0395;
  local_1220 = 0;
  local_1210 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1218 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1208 = "case0395";
  local_1200 = case0396;
  local_11f8 = 0;
  local_11e8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_11f0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_11e0 = "case0396";
  local_11d8 = case0397;
  local_11d0 = 0;
  local_11c0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_11c8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_11b8 = "case0397";
  local_11b0 = case0398;
  local_11a8 = 0;
  local_1198 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_11a0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1190 = "case0398";
  local_1188 = case0399;
  local_1180 = 0;
  local_1170 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1178 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1168 = "case0399";
  local_1160 = case0400;
  local_1158 = 0;
  local_1148 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1150 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1140 = "case0400";
  local_1138 = case0401;
  local_1130 = 0;
  local_1120 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1128 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1118 = "case0401";
  local_1110 = case0402;
  local_1108 = 0;
  local_10f8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1100 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_10f0 = "case0402";
  local_10e8 = case0403;
  local_10e0 = 0;
  local_10d0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_10d8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_10c8 = "case0403";
  local_10c0 = case0404;
  local_10b8 = 0;
  local_10a8 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_10b0 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_10a0 = "case0404";
  local_1098 = case0405;
  local_1090 = 0;
  local_1080 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1088 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1078 = "case0405";
  local_1070 = case0406;
  local_1068 = 0;
  local_1058 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1060 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1050 = "case0406";
  local_1048 = case0407;
  local_1040 = 0;
  local_1030 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1038 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1028 = "case0407";
  local_1020 = case0408;
  local_1018 = 0;
  local_1008 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_invoke;
  local_1010 = std::
               _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
               ::_M_manager;
  local_1000 = "case0408";
  local_ff8 = case0409;
  local_ff0 = 0;
  local_fe0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_fe8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_fd8 = "case0409";
  local_fd0 = case0410;
  local_fc8 = 0;
  local_fb8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_fc0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_fb0 = "case0410";
  local_fa8 = case0411;
  local_fa0 = 0;
  local_f90 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_f98 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f88 = "case0411";
  local_f80 = case0412;
  local_f78 = 0;
  local_f68 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_f70 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f60 = "case0412";
  local_f58 = case0413;
  local_f50 = 0;
  local_f40 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_f48 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f38 = "case0413";
  local_f30 = case0414;
  local_f28 = 0;
  local_f18 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_f20 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_f10 = "case0414";
  local_f08 = case0415;
  local_f00 = 0;
  local_ef0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ef8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ee8 = "case0415";
  local_ee0 = case0416;
  local_ed8 = 0;
  local_ec8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ed0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ec0 = "case0416";
  local_eb8 = case0417;
  local_eb0 = 0;
  local_ea0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ea8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e98 = "case0417";
  local_e90 = case0418;
  local_e88 = 0;
  local_e78 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_e80 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e70 = "case0418";
  local_e68 = case0419;
  local_e60 = 0;
  local_e50 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_e58 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e48 = "case0419";
  local_e40 = case0420;
  local_e38 = 0;
  local_e28 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_e30 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_e20 = "case0420";
  local_e18 = case0421;
  local_e10 = 0;
  local_e00 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_e08 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_df8 = "case0421";
  local_df0 = case0422;
  local_de8 = 0;
  local_dd8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_de0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_dd0 = "case0422";
  local_dc8 = case0423;
  local_dc0 = 0;
  local_db0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_db8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_da8 = "case0423";
  local_da0 = case0424;
  local_d98 = 0;
  local_d88 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_d90 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d80 = "case0424";
  local_d78 = case0425;
  local_d70 = 0;
  local_d60 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_d68 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d58 = "case0425";
  local_d50 = case0426;
  local_d48 = 0;
  local_d38 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_d40 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d30 = "case0426";
  local_d28 = case0427;
  local_d20 = 0;
  local_d10 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_d18 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_d08 = "case0427";
  local_d00 = case0428;
  local_cf8 = 0;
  local_ce8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_cf0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ce0 = "case0428";
  local_cd8 = case0429;
  local_cd0 = 0;
  local_cc0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_cc8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_cb8 = "case0429";
  local_cb0 = case0430;
  local_ca8 = 0;
  local_c98 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ca0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c90 = "case0430";
  local_c88 = case0431;
  local_c80 = 0;
  local_c70 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_c78 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c68 = "case0431";
  local_c60 = case0432;
  local_c58 = 0;
  local_c48 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_c50 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c40 = "case0432";
  local_c38 = case0433;
  local_c30 = 0;
  local_c20 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_c28 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_c18 = "case0433";
  local_c10 = case0434;
  local_c08 = 0;
  local_bf8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_c00 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_bf0 = "case0434";
  local_be8 = case0435;
  local_be0 = 0;
  local_bd0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_bd8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_bc8 = "case0435";
  local_bc0 = case0436;
  local_bb8 = 0;
  local_ba8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_bb0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ba0 = "case0436";
  local_b98 = case0437;
  local_b90 = 0;
  local_b80 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_b88 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b78 = "case0437";
  local_b70 = case0438;
  local_b68 = 0;
  local_b58 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_b60 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b50 = "case0438";
  local_b48 = case0439;
  local_b40 = 0;
  local_b30 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_b38 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b28 = "case0439";
  local_b20 = case0440;
  local_b18 = 0;
  local_b08 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_b10 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_b00 = "case0440";
  local_af8 = case0441;
  local_af0 = 0;
  local_ae0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ae8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ad8 = "case0441";
  local_ad0 = case0442;
  local_ac8 = 0;
  local_ab8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_ac0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_ab0 = "case0442";
  local_aa8 = case0443;
  local_aa0 = 0;
  local_a90 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_a98 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a88 = "case0443";
  local_a80 = case0444;
  local_a78 = 0;
  local_a68 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_a70 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a60 = "case0444";
  local_a58 = case0445;
  local_a50 = 0;
  local_a40 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_a48 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a38 = "case0445";
  local_a30 = case0446;
  local_a28 = 0;
  local_a18 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_a20 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_a10 = "case0446";
  local_a08 = case0447;
  local_a00 = 0;
  local_9f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_9f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_9e8 = "case0447";
  local_9e0 = case0448;
  local_9d8 = 0;
  local_9c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_9d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_9c0 = "case0448";
  local_9b8 = case0449;
  local_9b0 = 0;
  local_9a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_9a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_998 = "case0449";
  local_990 = case0450;
  local_988 = 0;
  local_978 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_980 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_970 = "case0450";
  local_968 = case0451;
  local_960 = 0;
  local_950 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_958 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_948 = "case0451";
  local_940 = case0452;
  local_938 = 0;
  local_928 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_930 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_920 = "case0452";
  local_918 = case0453;
  local_910 = 0;
  local_900 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_908 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_8f8 = "case0453";
  local_8f0 = case0454;
  local_8e8 = 0;
  local_8d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_8e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_8d0 = "case0454";
  local_8c8 = case0455;
  local_8c0 = 0;
  local_8b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_8b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_8a8 = "case0455";
  local_8a0 = case0456;
  local_898 = 0;
  local_888 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_890 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_880 = "case0456";
  local_878 = case0457;
  local_870 = 0;
  local_860 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_868 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_858 = "case0457";
  local_850 = case0458;
  local_848 = 0;
  local_838 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_840 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_830 = "case0458";
  local_828 = case0459;
  local_820 = 0;
  local_810 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_818 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_808 = "case0459";
  local_800 = case0460;
  local_7f8 = 0;
  local_7e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_7f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_7e0 = "case0460";
  local_7d8 = case0461;
  local_7d0 = 0;
  local_7c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_7c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_7b8 = "case0461";
  local_7b0 = case0462;
  local_7a8 = 0;
  local_798 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_7a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_790 = "case0462";
  local_788 = case0463;
  local_780 = 0;
  local_770 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_778 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_768 = "case0463";
  local_760 = case0464;
  local_758 = 0;
  local_748 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_750 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_740 = "case0464";
  local_738 = case0465;
  local_730 = 0;
  local_720 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_728 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_718 = "case0465";
  local_710 = case0466;
  local_708 = 0;
  local_6f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_700 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_6f0 = "case0466";
  local_6e8 = case0467;
  local_6e0 = 0;
  local_6d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_6d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_6c8 = "case0467";
  local_6c0 = case0468;
  local_6b8 = 0;
  local_6a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_6b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_6a0 = "case0468";
  local_698 = case0469;
  local_690 = 0;
  local_680 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_688 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_678 = "case0469";
  local_670 = case0470;
  local_668 = 0;
  local_658 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_660 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_650 = "case0470";
  local_648 = case0471;
  local_640 = 0;
  local_630 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_638 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_628 = "case0471";
  local_620 = case0472;
  local_618 = 0;
  local_608 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_610 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_600 = "case0472";
  local_5f8 = case0473;
  local_5f0 = 0;
  local_5e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_5e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_5d8 = "case0473";
  local_5d0 = case0474;
  local_5c8 = 0;
  local_5b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_5c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_5b0 = "case0474";
  local_5a8 = case0475;
  local_5a0 = 0;
  local_590 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_598 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_588 = "case0475";
  local_580 = case0476;
  local_578 = 0;
  local_568 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_570 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_560 = "case0476";
  local_558 = case0477;
  local_550 = 0;
  local_540 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_548 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_538 = "case0477";
  local_530 = case0478;
  local_528 = 0;
  local_518 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_520 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_510 = "case0478";
  local_508 = case0479;
  local_500 = 0;
  local_4f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_4f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_4e8 = "case0479";
  local_4e0 = case0480;
  local_4d8 = 0;
  local_4c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_4d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_4c0 = "case0480";
  local_4b8 = case0481;
  local_4b0 = 0;
  local_4a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_498 = "case0481";
  local_490 = case0482;
  local_488 = 0;
  local_478 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_480 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_470 = "case0482";
  local_468 = case0483;
  local_460 = 0;
  local_450 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_458 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_448 = "case0483";
  local_440 = case0484;
  local_438 = 0;
  local_428 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_430 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_420 = "case0484";
  local_418 = case0485;
  local_410 = 0;
  local_400 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_408 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_3f8 = "case0485";
  local_3f0 = case0486;
  local_3e8 = 0;
  local_3d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_3e0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_3d0 = "case0486";
  local_3c8 = case0487;
  local_3c0 = 0;
  local_3b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_3b8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_3a8 = "case0487";
  local_3a0 = case0488;
  local_398 = 0;
  local_388 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_390 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_380 = "case0488";
  local_378 = case0489;
  local_370 = 0;
  local_360 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_368 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_358 = "case0489";
  local_350 = case0490;
  local_348 = 0;
  local_338 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_340 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_330 = "case0490";
  local_328 = case0491;
  local_320 = 0;
  local_310 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_318 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_308 = "case0491";
  local_300 = case0492;
  local_2f8 = 0;
  local_2e8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_2f0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_2e0 = "case0492";
  local_2d8 = case0493;
  local_2d0 = 0;
  local_2c0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_2c8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_2b8 = "case0493";
  local_2b0 = case0494;
  local_2a8 = 0;
  local_298 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_2a0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_290 = "case0494";
  local_288 = case0495;
  local_280 = 0;
  local_270 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_278 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_268 = "case0495";
  local_260 = case0496;
  local_258 = 0;
  local_248 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_250 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_240 = "case0496";
  local_238 = case0497;
  local_230 = 0;
  local_220 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_218 = "case0497";
  local_210 = case0498;
  local_208 = 0;
  local_1f8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_1f0 = "case0498";
  local_1e8 = case0499;
  local_1e0 = 0;
  local_1d0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_1d8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_1c8 = "case0499";
  local_1c0 = case0500;
  local_1b8 = 0;
  local_1a8 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_1b0 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_1a0 = "case0500";
  local_198 = case0501;
  local_190 = 0;
  local_180 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_178 = "case0501";
  local_170 = case0502;
  local_168 = 0;
  local_158 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_150 = "case0502";
  local_148 = case0503;
  local_140 = 0;
  local_130 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_128 = "case0503";
  local_120 = case0504;
  local_118 = 0;
  local_108 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_invoke;
  local_110 = std::
              _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
              ::_M_manager;
  local_100 = "case0504";
  local_f8 = case0505;
  local_f0 = 0;
  local_e0 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_d8 = "case0505";
  local_d0 = case0506;
  local_c8 = 0;
  local_b8 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_b0 = "case0506";
  local_a8 = case0507;
  local_a0 = 0;
  local_90 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_88 = "case0507";
  local_80 = case0508;
  local_78 = 0;
  local_68 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_60 = "case0508";
  local_58 = case0509;
  local_50 = 0;
  local_40 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(psy::C::SemanticModelTester_*),_void_(psy::C::SemanticModelTester::*)()>
             ::_M_manager;
  local_38 = "case0509";
  __l._M_len = 0x10e;
  __l._M_array = (iterator)local_2a60;
  std::
  vector<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::SemanticModelTester_*)>,_const_char_*>_>_>
  ::vector(&this->tests_,__l,local_2a69);
  lVar2 = -0x2a30;
  ppcVar1 = &local_58;
  do {
    if (ppcVar1[2] != (code *)0x0) {
      (*ppcVar1[2])(ppcVar1,ppcVar1,3);
    }
    ppcVar1 = ppcVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  return;
}

Assistant:

SemanticModelTester(TestSuite* suite) : Tester(suite) {}